

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O1

int Map_SuperTableInsert(Map_HashTable_t *p,uint *uTruth,Map_Super_t *pGate,uint uPhase)

{
  Map_HashEntry_t **ppMVar1;
  ulong uVar2;
  Map_HashEntry_t *pMVar3;
  
  if (p->nBins * 2 <= p->nEntries) {
    Map_SuperTableResize(p);
  }
  uVar2 = (ulong)(uTruth[1] * 0x7d3 + *uTruth) % (ulong)(uint)p->nBins;
  pMVar3 = p->pBins[uVar2];
  while( true ) {
    if (pMVar3 == (Map_HashEntry_t *)0x0) {
      pMVar3 = (Map_HashEntry_t *)Extra_MmFixedEntryFetch(p->mmMan);
      pMVar3->uTruth[0] = 0;
      pMVar3->uTruth[1] = 0;
      *(undefined8 *)&pMVar3->uPhase = 0;
      pMVar3->pGates = (Map_Super_t *)0x0;
      pMVar3->pNext = (Map_HashEntry_t *)0x0;
      pMVar3->uTruth[0] = *uTruth;
      pMVar3->uTruth[1] = uTruth[1];
      pMVar3->pGates = pGate;
      pMVar3->uPhase = uPhase;
      ppMVar1 = p->pBins;
      pMVar3->pNext = ppMVar1[uVar2];
      ppMVar1[uVar2] = pMVar3;
      p->nEntries = p->nEntries + 1;
      return 0;
    }
    if ((pMVar3->uTruth[0] == *uTruth) && (pMVar3->uTruth[1] == uTruth[1])) break;
    pMVar3 = pMVar3->pNext;
  }
  return 1;
}

Assistant:

int Map_SuperTableInsert( Map_HashTable_t * p, unsigned uTruth[], Map_Super_t * pGate, unsigned uPhase )
{
    Map_HashEntry_t * pEnt;
    unsigned Key;
    // resize the table
    if ( p->nEntries >= 2 * p->nBins )
        Map_SuperTableResize( p );
    // check if this entry already exists
    Key = MAP_TABLE_HASH( uTruth[0], uTruth[1], p->nBins );
    for ( pEnt = p->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->uTruth[0] == uTruth[0] && pEnt->uTruth[1] == uTruth[1] )
            return 1;
    // add the new hash table entry to the table
    pEnt = (Map_HashEntry_t *)Extra_MmFixedEntryFetch( p->mmMan );
    memset( pEnt, 0, sizeof(Map_HashEntry_t) );
    pEnt->uTruth[0] = uTruth[0];
    pEnt->uTruth[1] = uTruth[1];
    pEnt->pGates    = pGate;
    pEnt->uPhase    = uPhase;
    // add the hash table to the corresponding linked list in the table
    pEnt->pNext   = p->pBins[Key];
    p->pBins[Key] = pEnt;
    p->nEntries++;
/*
printf( "Adding gate: %10u ", Key );
Map_LibraryPrintSupergate( pGate );
Extra_PrintBinary( stdout, uTruth, 32 );
printf( "\n" );
*/
    return 0;
}